

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_factory.hpp
# Opt level: O0

auto_ptr<iutest::Test> __thiscall
iutest::detail::iuFactory<iu_StringSplitRvalue_x_iutest_x_chain_at_first_back_by_c_str_Test<char>_>
::Create(iuFactory<iu_StringSplitRvalue_x_iutest_x_chain_at_first_back_by_c_str_Test<char>_> *this)

{
  Test *p_00;
  iuFactory<iu_StringSplitRvalue_x_iutest_x_chain_at_first_back_by_c_str_Test<char>_> *this_local;
  auto_ptr<iutest::Test> *p;
  
  p_00 = (Test *)operator_new(0x30);
  (p_00->m_random).m_engine.m_v3 = 0;
  (p_00->m_random).m_engine.m_v4 = 0;
  *(undefined8 *)&p_00->m_random_seed = 0;
  p_00->m_test_info = (iuITestInfoMediator *)0x0;
  (p_00->m_random).m_engine.m_v1 = 0;
  (p_00->m_random).m_engine.m_v2 = 0;
  p_00->_vptr_Test = (_func_int **)0x0;
  p_00->test_info_ = (TestInfo *)0x0;
  iu_StringSplitRvalue_x_iutest_x_chain_at_first_back_by_c_str_Test<char>::
  iu_StringSplitRvalue_x_iutest_x_chain_at_first_back_by_c_str_Test
            ((iu_StringSplitRvalue_x_iutest_x_chain_at_first_back_by_c_str_Test<char> *)p_00);
  auto_ptr<iutest::Test>::auto_ptr((auto_ptr<iutest::Test> *)this,p_00);
  return (auto_ptr<iutest::Test>)(Test *)this;
}

Assistant:

virtual auto_ptr<Test> Create() IUTEST_CXX_OVERRIDE
    {
        auto_ptr<Test> p( new Tester() );
        return p;
    }